

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O2

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::computeMinMaxResidualActivity
          (SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *lp,int rowNumber,int colNumber,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *minAct,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *maxAct)

{
  uint *puVar1;
  int iVar2;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar3;
  pointer pnVar4;
  Real RVar5;
  bool bVar6;
  type_conflict5 tVar7;
  bool bVar8;
  double *pdVar9;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined7 uVar10;
  long lVar11;
  cpp_dec_float<50U,_int,_void> *pcVar12;
  bool bVar13;
  Item *pIVar14;
  long lVar15;
  undefined1 local_268 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_260;
  uint local_258 [3];
  undefined3 uStack_24b;
  uint local_248;
  undefined3 uStack_243;
  int local_240;
  bool local_23c;
  undefined8 local_238;
  __shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *local_230;
  cpp_dec_float<50U,_int,_void> *local_228;
  cpp_dec_float<50U,_int,_void> *local_220;
  ulong local_218;
  int local_20c;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_208;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1c8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_188;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_148;
  cpp_dec_float<50U,_int,_void> local_110;
  cpp_dec_float<50U,_int,_void> local_d8;
  cpp_dec_float<50U,_int,_void> local_a0;
  cpp_dec_float<50U,_int,_void> local_68;
  
  pIVar14 = (lp->
            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .set.theitem +
            (lp->
            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .set.thekey[rowNumber].idx;
  lVar15 = 0;
  local_220 = &minAct->m_backend;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=(&minAct->m_backend,0);
  local_228 = &maxAct->m_backend;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=(&maxAct->m_backend,0);
  local_230 = &(this->
               super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>;
  lVar11 = 0;
  bVar13 = false;
  local_218 = 0;
  local_20c = colNumber;
  do {
    if ((pIVar14->data).
        super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .memused <= lVar11) {
      if (bVar13) {
        pdVar9 = (double *)infinity();
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                  ((cpp_dec_float<50U,_int,_void> *)local_268,-*pdVar9,(type *)0x0);
        *(ulong *)((((cpp_dec_float<50U,_int,_void> *)&local_220->data)->data)._M_elems + 8) =
             CONCAT35(uStack_243,_local_248);
        *(undefined8 *)((((cpp_dec_float<50U,_int,_void> *)&local_220->data)->data)._M_elems + 4) =
             local_258._0_8_;
        *(ulong *)((((cpp_dec_float<50U,_int,_void> *)&local_220->data)->data)._M_elems + 6) =
             CONCAT35(uStack_24b,stack0xfffffffffffffdb0);
        (((cpp_dec_float<50U,_int,_void> *)&local_220->data)->data)._M_elems[0] = local_268._0_4_;
        (((cpp_dec_float<50U,_int,_void> *)&local_220->data)->data)._M_elems[1] = local_268._4_4_;
        (((cpp_dec_float<50U,_int,_void> *)&local_220->data)->data)._M_elems[2] =
             (uint)_Stack_260._M_pi;
        (((cpp_dec_float<50U,_int,_void> *)&local_220->data)->data)._M_elems[3] =
             _Stack_260._M_pi._4_4_;
        local_220->exp = local_240;
        local_220->neg = local_23c;
        local_220->fpclass = (fpclass_type)local_238;
        local_220->prec_elem = local_238._4_4_;
      }
      if ((local_218 & 1) != 0) {
        pdVar9 = (double *)infinity();
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                  ((cpp_dec_float<50U,_int,_void> *)local_268,*pdVar9,(type *)0x0);
        *(ulong *)((((cpp_dec_float<50U,_int,_void> *)&local_228->data)->data)._M_elems + 8) =
             CONCAT35(uStack_243,_local_248);
        *(undefined8 *)((((cpp_dec_float<50U,_int,_void> *)&local_228->data)->data)._M_elems + 4) =
             local_258._0_8_;
        *(ulong *)((((cpp_dec_float<50U,_int,_void> *)&local_228->data)->data)._M_elems + 6) =
             CONCAT35(uStack_24b,stack0xfffffffffffffdb0);
        *(undefined1 (*) [8])(((cpp_dec_float<50U,_int,_void> *)&local_228->data)->data)._M_elems =
             local_268;
        *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
         ((((cpp_dec_float<50U,_int,_void> *)&local_228->data)->data)._M_elems + 2) =
             _Stack_260._M_pi;
        local_228->exp = local_240;
        local_228->neg = local_23c;
        local_228->fpclass = (fpclass_type)local_238;
        local_228->prec_elem = local_238._4_4_;
      }
      return;
    }
    pNVar3 = (pIVar14->data).
             super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .m_elem;
    if ((local_20c < 0) || (*(int *)((long)(&pNVar3->val + 1) + lVar15) != local_20c)) {
      local_148.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)((long)&(pNVar3->val).m_backend.data + lVar15 + 0x20);
      puVar1 = (uint *)((long)&(pNVar3->val).m_backend.data + lVar15);
      local_148.m_backend.data._M_elems._0_8_ = *(undefined8 *)puVar1;
      local_148.m_backend.data._M_elems._8_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&(pNVar3->val).m_backend.data + lVar15 + 0x10);
      local_148.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      local_148.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
      local_148.m_backend.exp = *(int *)((long)&(pNVar3->val).m_backend.data + lVar15 + 0x28);
      local_148.m_backend.neg = *(bool *)((long)&(pNVar3->val).m_backend.data + lVar15 + 0x2c);
      local_148.m_backend._48_8_ =
           *(undefined8 *)((long)&(pNVar3->val).m_backend.data + lVar15 + 0x30);
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                (&local_68,0.0,(type *)0x0);
      std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)local_268,local_230
                );
      RVar5 = Tolerances::epsilon((Tolerances *)local_268);
      bVar6 = GT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                        (&local_148,
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_68,RVar5);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_260);
      pNVar3 = (pIVar14->data).
               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .m_elem;
      if (bVar6) {
        iVar2 = *(int *)((long)(&pNVar3->val + 1) + lVar15);
        pnVar4 = (lp->
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).low.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pdVar9 = (double *)infinity();
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                  ((cpp_dec_float<50U,_int,_void> *)local_268,-*pdVar9,(type *)0x0);
        tVar7 = boost::multiprecision::operator<=
                          (pnVar4 + iVar2,
                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)local_268);
        bVar6 = true;
        if (!tVar7) {
          pNVar3 = (pIVar14->data).
                   super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .m_elem;
          pcVar12 = &(lp->
                     super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).low.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start
                     [*(int *)((long)(&pNVar3->val + 1) + lVar15)].m_backend;
LAB_0028293b:
          local_238._0_4_ = cpp_dec_float_finite;
          local_238._4_4_ = 10;
          local_268 = (undefined1  [8])0x0;
          _Stack_260._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_258[0] = 0;
          local_258[1] = 0;
          stack0xfffffffffffffdb0 = 0;
          uStack_24b = 0;
          _local_248 = 0;
          uStack_243 = 0;
          local_240 = 0;
          local_23c = false;
          boost::multiprecision::default_ops::
          eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    ((cpp_dec_float<50U,_int,_void> *)local_268,
                     (cpp_dec_float<50U,_int,_void> *)((long)&(pNVar3->val).m_backend.data + lVar15)
                     ,pcVar12);
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                    (local_220,(cpp_dec_float<50U,_int,_void> *)local_268);
          bVar6 = bVar13;
        }
      }
      else {
        local_188.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)((long)&(pNVar3->val).m_backend.data + lVar15 + 0x20);
        puVar1 = (uint *)((long)&(pNVar3->val).m_backend.data + lVar15);
        local_188.m_backend.data._M_elems._0_8_ = *(undefined8 *)puVar1;
        local_188.m_backend.data._M_elems._8_8_ = *(undefined8 *)(puVar1 + 2);
        puVar1 = (uint *)((long)&(pNVar3->val).m_backend.data + lVar15 + 0x10);
        local_188.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
        local_188.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
        local_188.m_backend.exp = *(int *)((long)&(pNVar3->val).m_backend.data + lVar15 + 0x28);
        local_188.m_backend.neg = *(bool *)((long)&(pNVar3->val).m_backend.data + lVar15 + 0x2c);
        local_188.m_backend._48_8_ =
             *(undefined8 *)((long)&(pNVar3->val).m_backend.data + lVar15 + 0x30);
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                  (&local_110,0.0,(type *)0x0);
        std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)local_268,
                   local_230);
        RVar5 = Tolerances::epsilon((Tolerances *)local_268);
        bVar8 = LT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                          (&local_188,
                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_110,RVar5);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_260);
        bVar6 = bVar13;
        if (bVar8) {
          iVar2 = *(int *)((long)(&((pIVar14->data).
                                    super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   .m_elem)->val + 1) + lVar15);
          pnVar4 = (lp->
                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).up.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pdVar9 = (double *)infinity();
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                    ((cpp_dec_float<50U,_int,_void> *)local_268,*pdVar9,(type *)0x0);
          tVar7 = boost::multiprecision::operator>=
                            (pnVar4 + iVar2,
                             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)local_268);
          bVar6 = true;
          if (!tVar7) {
            pNVar3 = (pIVar14->data).
                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .m_elem;
            pcVar12 = &(lp->
                       super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).up.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start
                       [*(int *)((long)(&pNVar3->val + 1) + lVar15)].m_backend;
            goto LAB_0028293b;
          }
        }
      }
      pNVar3 = (pIVar14->data).
               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .m_elem;
      local_1c8.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)((long)&(pNVar3->val).m_backend.data + lVar15 + 0x20);
      puVar1 = (uint *)((long)&(pNVar3->val).m_backend.data + lVar15);
      local_1c8.m_backend.data._M_elems._0_8_ = *(undefined8 *)puVar1;
      local_1c8.m_backend.data._M_elems._8_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&(pNVar3->val).m_backend.data + lVar15 + 0x10);
      local_1c8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      local_1c8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
      local_1c8.m_backend.exp = *(int *)((long)&(pNVar3->val).m_backend.data + lVar15 + 0x28);
      local_1c8.m_backend.neg = *(bool *)((long)&(pNVar3->val).m_backend.data + lVar15 + 0x2c);
      local_1c8.m_backend._48_8_ =
           *(undefined8 *)((long)&(pNVar3->val).m_backend.data + lVar15 + 0x30);
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                (&local_a0,0.0,(type *)0x0);
      std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)local_268,local_230
                );
      RVar5 = Tolerances::epsilon((Tolerances *)local_268);
      bVar8 = GT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                        (&local_1c8,
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_a0,RVar5);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_260);
      pNVar3 = (pIVar14->data).
               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .m_elem;
      bVar13 = bVar6;
      if (bVar8) {
        iVar2 = *(int *)((long)(&pNVar3->val + 1) + lVar15);
        pnVar4 = (lp->
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).up.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pdVar9 = (double *)infinity();
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                  ((cpp_dec_float<50U,_int,_void> *)local_268,*pdVar9,(type *)0x0);
        tVar7 = boost::multiprecision::operator>=
                          (pnVar4 + iVar2,
                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)local_268);
        uVar10 = extraout_var;
        if (tVar7) {
LAB_00282b54:
          local_218 = CONCAT71(uVar10,1);
        }
        else {
          pNVar3 = (pIVar14->data).
                   super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .m_elem;
          pcVar12 = &(lp->
                     super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).up.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start
                     [*(int *)((long)(&pNVar3->val + 1) + lVar15)].m_backend;
LAB_00282b73:
          local_238._0_4_ = cpp_dec_float_finite;
          local_238._4_4_ = 10;
          local_268 = (undefined1  [8])0x0;
          _Stack_260._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_258[0] = 0;
          local_258[1] = 0;
          stack0xfffffffffffffdb0 = 0;
          uStack_24b = 0;
          _local_248 = 0;
          uStack_243 = 0;
          local_240 = 0;
          local_23c = false;
          boost::multiprecision::default_ops::
          eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    ((cpp_dec_float<50U,_int,_void> *)local_268,
                     (cpp_dec_float<50U,_int,_void> *)((long)&(pNVar3->val).m_backend.data + lVar15)
                     ,pcVar12);
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                    (local_228,(cpp_dec_float<50U,_int,_void> *)local_268);
        }
      }
      else {
        local_208.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)((long)&(pNVar3->val).m_backend.data + lVar15 + 0x20);
        puVar1 = (uint *)((long)&(pNVar3->val).m_backend.data + lVar15);
        local_208.m_backend.data._M_elems._0_8_ = *(undefined8 *)puVar1;
        local_208.m_backend.data._M_elems._8_8_ = *(undefined8 *)(puVar1 + 2);
        puVar1 = (uint *)((long)&(pNVar3->val).m_backend.data + lVar15 + 0x10);
        local_208.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
        local_208.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
        local_208.m_backend.exp = *(int *)((long)&(pNVar3->val).m_backend.data + lVar15 + 0x28);
        local_208.m_backend.neg = *(bool *)((long)&(pNVar3->val).m_backend.data + lVar15 + 0x2c);
        local_208.m_backend._48_8_ =
             *(undefined8 *)((long)&(pNVar3->val).m_backend.data + lVar15 + 0x30);
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                  (&local_d8,0.0,(type *)0x0);
        std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)local_268,
                   local_230);
        RVar5 = Tolerances::epsilon((Tolerances *)local_268);
        bVar6 = LT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                          (&local_208,
                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_d8,RVar5);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_260);
        if (bVar6) {
          iVar2 = *(int *)((long)(&((pIVar14->data).
                                    super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   .m_elem)->val + 1) + lVar15);
          pnVar4 = (lp->
                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).low.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pdVar9 = (double *)infinity();
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                    ((cpp_dec_float<50U,_int,_void> *)local_268,-*pdVar9,(type *)0x0);
          tVar7 = boost::multiprecision::operator<=
                            (pnVar4 + iVar2,
                             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)local_268);
          uVar10 = extraout_var_00;
          if (tVar7) goto LAB_00282b54;
          pNVar3 = (pIVar14->data).
                   super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .m_elem;
          pcVar12 = &(lp->
                     super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).low.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start
                     [*(int *)((long)(&pNVar3->val + 1) + lVar15)].m_backend;
          goto LAB_00282b73;
        }
      }
    }
    lVar11 = lVar11 + 1;
    lVar15 = lVar15 + 0x3c;
  } while( true );
}

Assistant:

void SPxMainSM<R>::computeMinMaxResidualActivity(SPxLPBase<R>& lp, int rowNumber, int colNumber,
      R& minAct, R& maxAct)
{
   const SVectorBase<R>& row = lp.rowVector(rowNumber);
   bool minNegInfinite = false;
   bool maxInfinite = false;

   minAct = 0;   // this is the minimum value that the aggregation can attain
   maxAct = 0;   // this is the maximum value that the aggregation can attain

   for(int l = 0; l < row.size(); ++l)
   {
      if(colNumber < 0 || row.index(l) != colNumber)
      {
         // computing the minimum activity of the aggregated variables
         if(GT(row.value(l), R(0.0), this->tolerances()->epsilon()))
         {
            if(lp.lower(row.index(l)) <= R(-infinity))
               minNegInfinite = true;
            else
               minAct += row.value(l) * lp.lower(row.index(l));
         }
         else if(LT(row.value(l), R(0.0), this->tolerances()->epsilon()))
         {
            if(lp.upper(row.index(l)) >= R(infinity))
               minNegInfinite = true;
            else
               minAct += row.value(l) * lp.upper(row.index(l));
         }

         // computing the maximum activity of the aggregated variables
         if(GT(row.value(l), R(0.0), this->tolerances()->epsilon()))
         {
            if(lp.upper(row.index(l)) >= R(infinity))
               maxInfinite = true;
            else
               maxAct += row.value(l) * lp.upper(row.index(l));
         }
         else if(LT(row.value(l), R(0.0), this->tolerances()->epsilon()))
         {
            if(lp.lower(row.index(l)) <= R(-infinity))
               maxInfinite = true;
            else
               maxAct += row.value(l) * lp.lower(row.index(l));
         }
      }
   }

   // if an infinite value exists for the minimum activity, then that it taken
   if(minNegInfinite)
      minAct = R(-infinity);

   // if an -infinite value exists for the maximum activity, then that value is taken
   if(maxInfinite)
      maxAct = R(infinity);
}